

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

int color_tree_get(ColorTree *tree,uchar r,uchar g,uchar b,uchar a)

{
  int iVar1;
  byte bVar2;
  int local_20;
  int i;
  int bit;
  uchar a_local;
  uchar b_local;
  uchar g_local;
  uchar r_local;
  ColorTree *tree_local;
  
  bit = 0;
  tree_local = tree;
  while( true ) {
    if (7 < bit) {
      if (tree_local == (ColorTree *)0x0) {
        local_20 = -1;
      }
      else {
        local_20 = tree_local->index;
      }
      return local_20;
    }
    bVar2 = (byte)bit;
    iVar1 = ((int)(uint)r >> (bVar2 & 0x1f) & 1U) * 8 + ((int)(uint)g >> (bVar2 & 0x1f) & 1U) * 4 +
            ((int)(uint)b >> (bVar2 & 0x1f) & 1U) * 2 + ((int)(uint)a >> (bVar2 & 0x1f) & 1U);
    if (tree_local->children[iVar1] == (ColorTree *)0x0) break;
    tree_local = tree_local->children[iVar1];
    bit = bit + 1;
  }
  return -1;
}

Assistant:

static int color_tree_get(ColorTree* tree, unsigned char r, unsigned char g, unsigned char b, unsigned char a) {
  int bit = 0;
  for(bit = 0; bit < 8; ++bit) {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if(!tree->children[i]) return -1;
    else tree = tree->children[i];
  }
  return tree ? tree->index : -1;
}